

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_closure.cpp
# Opt level: O0

UnicodeSet * __thiscall
icu_63::UnicodeSet::applyPattern
          (UnicodeSet *this,UnicodeString *pattern,ParsePosition *pos,uint32_t options,
          SymbolTable *symbols,UErrorCode *status)

{
  UBool UVar1;
  undefined1 local_a8 [8];
  RuleCharacterIterator chars;
  UnicodeString rebuiltPat;
  UErrorCode *status_local;
  SymbolTable *symbols_local;
  uint32_t options_local;
  ParsePosition *pos_local;
  UnicodeString *pattern_local;
  UnicodeSet *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UVar1 = isFrozen(this);
    if (UVar1 == '\0') {
      UnicodeString::UnicodeString((UnicodeString *)&chars.bufPos);
      RuleCharacterIterator::RuleCharacterIterator
                ((RuleCharacterIterator *)local_a8,pattern,symbols,pos);
      applyPattern(this,(RuleCharacterIterator *)local_a8,symbols,(UnicodeString *)&chars.bufPos,
                   options,0,0x41da40,(UErrorCode *)0x0);
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 == '\0') {
        UVar1 = RuleCharacterIterator::inVariable((RuleCharacterIterator *)local_a8);
        if (UVar1 == '\0') {
          setPattern(this,(UnicodeString *)&chars.bufPos);
        }
        else {
          *status = U_MALFORMED_SET;
        }
      }
      UnicodeString::~UnicodeString((UnicodeString *)&chars.bufPos);
    }
    else {
      *status = U_NO_WRITE_PERMISSION;
    }
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::applyPattern(const UnicodeString& pattern,
                              ParsePosition& pos,
                              uint32_t options,
                              const SymbolTable* symbols,
                              UErrorCode& status) {
    if (U_FAILURE(status)) {
        return *this;
    }
    if (isFrozen()) {
        status = U_NO_WRITE_PERMISSION;
        return *this;
    }
    // Need to build the pattern in a temporary string because
    // _applyPattern calls add() etc., which set pat to empty.
    UnicodeString rebuiltPat;
    RuleCharacterIterator chars(pattern, symbols, pos);
    applyPattern(chars, symbols, rebuiltPat, options, &UnicodeSet::closeOver, 0, status);
    if (U_FAILURE(status)) return *this;
    if (chars.inVariable()) {
        // syntaxError(chars, "Extra chars in variable value");
        status = U_MALFORMED_SET;
        return *this;
    }
    setPattern(rebuiltPat);
    return *this;
}